

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void __thiscall
Highs::setNonbasicStatusInterface(Highs *this,HighsIndexCollection *index_collection,bool columns)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  byte in_DL;
  HighsIndexCollection *in_RSI;
  HighsInt *in_RDI;
  int8_t move_1;
  HighsBasisStatus status_1;
  double upper_1;
  double lower_1;
  HighsInt iRow;
  int8_t move;
  HighsBasisStatus status;
  double upper;
  double lower;
  HighsInt iCol;
  HighsInt k;
  HighsInt current_set_entry;
  HighsInt ignore_to_ix;
  HighsInt ignore_from_ix;
  HighsInt set_to_ix;
  HighsInt set_from_ix;
  HighsInt ix_dim;
  HighsInt to_k;
  HighsInt from_k;
  HighsLp *lp;
  SimplexBasis *simplex_basis;
  bool has_simplex_basis;
  HighsBasis *highs_basis;
  undefined6 in_stack_ffffffffffffff70;
  value_type in_stack_ffffffffffffff76;
  value_type in_stack_ffffffffffffff77;
  HighsInt *in_stack_ffffffffffffff78;
  HighsInt *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int iVar6;
  undefined2 in_stack_ffffffffffffff8c;
  value_type in_stack_ffffffffffffff8e;
  value_type vVar7;
  value_type in_stack_ffffffffffffff8f;
  value_type vVar8;
  HighsIndexCollection *in_stack_ffffffffffffff90;
  int local_60;
  int local_5c;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int *local_38;
  HighsInt *local_30;
  byte local_21;
  byte *local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20 = (byte *)(in_RDI + 0x1c);
  if ((*local_20 & 1) != 0) {
    local_21 = *(byte *)(in_RDI + 0xe13) & 1;
    local_30 = in_RDI + 0xf1c;
    local_38 = in_RDI + 0x4e;
    limits(in_RSI,&local_3c,&local_40);
    if ((local_11 & 1) == 0) {
      local_44 = local_38[1];
    }
    else {
      local_44 = *local_38;
    }
    for (local_5c = local_3c; local_5c <= local_40; local_5c = local_5c + 1) {
      updateOutInIndex(in_stack_ffffffffffffff90,
                       (HighsInt *)
                       CONCAT17(in_stack_ffffffffffffff8f,
                                CONCAT16(in_stack_ffffffffffffff8e,
                                         CONCAT24(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88))),
                       in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                       (HighsInt *)
                       CONCAT17(in_stack_ffffffffffffff77,
                                CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                       in_RDI);
      iVar6 = local_48;
      if ((local_11 & 1) == 0) {
        for (; in_stack_ffffffffffffff88 = iVar6, iVar6 <= local_4c; iVar6 = iVar6 + 1) {
          pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (local_20 + 0x48),(long)iVar6);
          if (*pvVar3 != kBasic) {
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_38 + 0x14),
                                (long)iVar6);
            in_stack_ffffffffffffff80 = (HighsInt *)*pvVar4;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_38 + 0x1a),
                                (long)iVar6);
            in_stack_ffffffffffffff78 = (HighsInt *)*pvVar4;
            pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (local_20 + 0x48),(long)iVar6);
            vVar8 = *pvVar3;
            if (((double)in_stack_ffffffffffffff80 != (double)in_stack_ffffffffffffff78) ||
               (NAN((double)in_stack_ffffffffffffff80) || NAN((double)in_stack_ffffffffffffff78))) {
              bVar2 = highs_isInfinity(-(double)in_stack_ffffffffffffff80);
              if (bVar2) {
                bVar2 = highs_isInfinity((double)in_stack_ffffffffffffff78);
                if (bVar2) {
                  vVar8 = kZero;
                }
                else {
                  vVar8 = kUpper;
                }
                vVar7 = !bVar2;
              }
              else {
                bVar2 = highs_isInfinity((double)in_stack_ffffffffffffff78);
                if (bVar2) {
                  vVar8 = kLower;
                  vVar7 = -1;
                }
                else if (vVar8 == kNonbasic) {
                  if (ABS((double)in_stack_ffffffffffffff78) <=
                      ABS((double)in_stack_ffffffffffffff80)) {
                    vVar8 = kUpper;
                    vVar7 = '\x01';
                  }
                  else {
                    vVar8 = kLower;
                    vVar7 = -1;
                  }
                }
                else if (vVar8 == kLower) {
                  vVar7 = -1;
                }
                else {
                  vVar7 = '\x01';
                }
              }
            }
            else {
              if (vVar8 == kNonbasic) {
                vVar8 = kLower;
              }
              vVar7 = '\0';
            }
            in_stack_ffffffffffffff77 = vVar8;
            pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (local_20 + 0x48),(long)iVar6);
            *pvVar3 = vVar8;
            in_stack_ffffffffffffff76 = vVar7;
            if ((local_21 & 1) != 0) {
              pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  (local_30 + 6),(long)(*local_38 + iVar6));
              *pvVar5 = '\x01';
              in_stack_ffffffffffffff76 = vVar7;
              pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  (local_30 + 0xc),(long)(*local_38 + iVar6));
              *pvVar5 = vVar7;
            }
          }
        }
      }
      else {
        for (local_60 = local_48; local_60 <= local_4c; local_60 = local_60 + 1) {
          pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (local_20 + 0x30),(long)local_60);
          if (*pvVar3 != kBasic) {
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_38 + 8),
                                (long)local_60);
            dVar1 = *pvVar4;
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_38 + 0xe),
                                (long)local_60);
            in_stack_ffffffffffffff90 = (HighsIndexCollection *)*pvVar4;
            pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (local_20 + 0x30),(long)local_60);
            vVar8 = *pvVar3;
            if ((dVar1 != (double)in_stack_ffffffffffffff90) ||
               (NAN(dVar1) || NAN((double)in_stack_ffffffffffffff90))) {
              bVar2 = highs_isInfinity(-dVar1);
              if (bVar2) {
                bVar2 = highs_isInfinity((double)in_stack_ffffffffffffff90);
                if (bVar2) {
                  vVar8 = kZero;
                  vVar7 = '\0';
                }
                else {
                  vVar8 = kUpper;
                  vVar7 = -1;
                }
              }
              else {
                bVar2 = highs_isInfinity((double)in_stack_ffffffffffffff90);
                if (bVar2) {
                  vVar8 = kLower;
                  vVar7 = '\x01';
                }
                else if (vVar8 == kNonbasic) {
                  if (ABS((double)in_stack_ffffffffffffff90) <= ABS(dVar1)) {
                    vVar8 = kUpper;
                    vVar7 = -1;
                  }
                  else {
                    vVar8 = kLower;
                    vVar7 = '\x01';
                  }
                }
                else if (vVar8 == kLower) {
                  vVar7 = '\x01';
                }
                else {
                  vVar7 = -1;
                }
              }
            }
            else {
              if (vVar8 == kNonbasic) {
                vVar8 = kLower;
              }
              vVar7 = '\0';
            }
            in_stack_ffffffffffffff8f = vVar8;
            pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (local_20 + 0x30),(long)local_60);
            *pvVar3 = vVar8;
            in_stack_ffffffffffffff8e = vVar7;
            if ((local_21 & 1) != 0) {
              pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  (local_30 + 6),(long)local_60);
              *pvVar5 = '\x01';
              in_stack_ffffffffffffff8e = vVar7;
              pvVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  (local_30 + 0xc),(long)local_60);
              *pvVar5 = vVar7;
            }
          }
        }
      }
      if (local_44 + -1 < 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

void Highs::setNonbasicStatusInterface(
    const HighsIndexCollection& index_collection, const bool columns) {
  HighsBasis& highs_basis = basis_;
  if (!highs_basis.valid) return;
  const bool has_simplex_basis = ekk_instance_.status_.has_basis;
  SimplexBasis& simplex_basis = ekk_instance_.basis_;
  HighsLp& lp = model_.lp_;

  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  HighsInt ix_dim;
  if (columns) {
    ix_dim = lp.num_col_;
  } else {
    ix_dim = lp.num_row_;
  }
  // Surely this is checked elsewhere
  assert(0 <= from_k && to_k < ix_dim);
  assert(from_k <= to_k);
  HighsInt set_from_ix;
  HighsInt set_to_ix;
  HighsInt ignore_from_ix;
  HighsInt ignore_to_ix = -1;
  HighsInt current_set_entry = 0;
  // Given a basic-nonbasic partition, all status settings are defined
  // by the bounds unless boxed, in which case any definitive (ie not
  // just kNonbasic) existing status is retained. Otherwise, set to
  // bound nearer to zero
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, set_from_ix, set_to_ix, ignore_from_ix,
                     ignore_to_ix, current_set_entry);
    assert(set_to_ix < ix_dim);
    assert(ignore_to_ix < ix_dim);
    if (columns) {
      for (HighsInt iCol = set_from_ix; iCol <= set_to_ix; iCol++) {
        if (highs_basis.col_status[iCol] == HighsBasisStatus::kBasic) continue;
        // Nonbasic column
        double lower = lp.col_lower_[iCol];
        double upper = lp.col_upper_[iCol];
        HighsBasisStatus status = highs_basis.col_status[iCol];
        int8_t move = kIllegalMoveValue;
        if (lower == upper) {
          if (status == HighsBasisStatus::kNonbasic)
            status = HighsBasisStatus::kLower;
          move = kNonbasicMoveZe;
        } else if (!highs_isInfinity(-lower)) {
          // Finite lower bound so boxed or lower
          if (!highs_isInfinity(upper)) {
            // Finite upper bound so boxed
            if (status == HighsBasisStatus::kNonbasic) {
              // No definitive status, so set to bound nearer to zero
              if (fabs(lower) < fabs(upper)) {
                status = HighsBasisStatus::kLower;
                move = kNonbasicMoveUp;
              } else {
                status = HighsBasisStatus::kUpper;
                move = kNonbasicMoveDn;
              }
            } else if (status == HighsBasisStatus::kLower) {
              move = kNonbasicMoveUp;
            } else {
              move = kNonbasicMoveDn;
            }
          } else {
            // Lower (since upper bound is infinite)
            status = HighsBasisStatus::kLower;
            move = kNonbasicMoveUp;
          }
        } else if (!highs_isInfinity(upper)) {
          // Upper
          status = HighsBasisStatus::kUpper;
          move = kNonbasicMoveDn;
        } else {
          // FREE
          status = HighsBasisStatus::kZero;
          move = kNonbasicMoveZe;
        }
        highs_basis.col_status[iCol] = status;
        if (has_simplex_basis) {
          assert(move != kIllegalMoveValue);
          simplex_basis.nonbasicFlag_[iCol] = kNonbasicFlagTrue;
          simplex_basis.nonbasicMove_[iCol] = move;
        }
      }
    } else {
      for (HighsInt iRow = set_from_ix; iRow <= set_to_ix; iRow++) {
        if (highs_basis.row_status[iRow] == HighsBasisStatus::kBasic) continue;
        // Nonbasic column
        double lower = lp.row_lower_[iRow];
        double upper = lp.row_upper_[iRow];
        HighsBasisStatus status = highs_basis.row_status[iRow];
        int8_t move = kIllegalMoveValue;
        if (lower == upper) {
          if (status == HighsBasisStatus::kNonbasic)
            status = HighsBasisStatus::kLower;
          move = kNonbasicMoveZe;
        } else if (!highs_isInfinity(-lower)) {
          // Finite lower bound so boxed or lower
          if (!highs_isInfinity(upper)) {
            // Finite upper bound so boxed
            if (status == HighsBasisStatus::kNonbasic) {
              // No definitive status, so set to bound nearer to zero
              if (fabs(lower) < fabs(upper)) {
                status = HighsBasisStatus::kLower;
                move = kNonbasicMoveDn;
              } else {
                status = HighsBasisStatus::kUpper;
                move = kNonbasicMoveUp;
              }
            } else if (status == HighsBasisStatus::kLower) {
              move = kNonbasicMoveDn;
            } else {
              move = kNonbasicMoveUp;
            }
          } else {
            // Lower (since upper bound is infinite)
            status = HighsBasisStatus::kLower;
            move = kNonbasicMoveDn;
          }
        } else if (!highs_isInfinity(upper)) {
          // Upper
          status = HighsBasisStatus::kUpper;
          move = kNonbasicMoveUp;
        } else {
          // FREE
          status = HighsBasisStatus::kZero;
          move = kNonbasicMoveZe;
        }
        highs_basis.row_status[iRow] = status;
        if (has_simplex_basis) {
          assert(move != kIllegalMoveValue);
          simplex_basis.nonbasicFlag_[lp.num_col_ + iRow] = kNonbasicFlagTrue;
          simplex_basis.nonbasicMove_[lp.num_col_ + iRow] = move;
        }
      }
    }
    if (ignore_to_ix >= ix_dim - 1) break;
  }
}